

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Sigmoid_x86_avx::forward_inplace(Sigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  ulong uVar9;
  float fVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar11 [16];
  float fVar31;
  float fVar33;
  float fVar34;
  undefined1 auVar17 [32];
  float fVar30;
  undefined1 auVar18 [32];
  undefined1 auVar22 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar32 [16];
  undefined1 extraout_var [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 local_108 [16];
  float local_b8;
  undefined1 auVar21 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar40 [32];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    auVar50 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    do {
      auVar36._8_4_ = 0x3c088908;
      auVar36._0_8_ = 0x3c0889083c088908;
      auVar45._8_4_ = 0xc2b0c0a5;
      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar35._8_4_ = 0x42b0c0a5;
      auVar35._0_8_ = 0x42b0c0a542b0c0a5;
      auVar36._12_4_ = 0x3c088908;
      auVar45._12_4_ = 0xc2b0c0a5;
      auVar35._12_4_ = 0x42b0c0a5;
      auVar45._16_4_ = 0xc2b0c0a5;
      auVar40._16_4_ = 0x42b0c0a5;
      auVar40._0_16_ = auVar35;
      auVar45._20_4_ = 0xc2b0c0a5;
      auVar40._20_4_ = 0x42b0c0a5;
      auVar45._24_4_ = 0xc2b0c0a5;
      auVar40._24_4_ = 0x42b0c0a5;
      auVar45._28_4_ = 0xc2b0c0a5;
      auVar40._28_4_ = 0x42b0c0a5;
      pauVar8 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar6 < 8) {
        uVar3 = 0;
        auVar35 = auVar36;
      }
      else {
        iVar2 = 7;
        auVar46._8_4_ = 0x3f800000;
        auVar46._0_8_ = 0x3f8000003f800000;
        auVar46._12_4_ = 0x3f800000;
        do {
          auVar17._0_8_ = *(ulong *)*pauVar8 ^ 0x8000000080000000;
          auVar17._8_4_ = *(uint *)(*pauVar8 + 8) ^ 0x80000000;
          auVar17._12_4_ = *(uint *)(*pauVar8 + 0xc) ^ 0x80000000;
          auVar17._16_4_ = *(uint *)(*pauVar8 + 0x10) ^ 0x80000000;
          auVar17._20_4_ = *(uint *)(*pauVar8 + 0x14) ^ 0x80000000;
          auVar17._24_4_ = *(uint *)(*pauVar8 + 0x18) ^ 0x80000000;
          auVar17._28_4_ = *(uint *)(*pauVar8 + 0x1c) ^ 0x80000000;
          auVar17 = vminps_avx(auVar17,auVar40);
          auVar19 = vmaxps_avx(auVar17,auVar45);
          auVar41._0_4_ = auVar19._0_4_ * 1.442695 + 0.5;
          auVar41._4_4_ = auVar19._4_4_ * 1.442695 + 0.5;
          auVar41._8_4_ = auVar19._8_4_ * 1.442695 + 0.5;
          auVar41._12_4_ = auVar19._12_4_ * 1.442695 + 0.5;
          auVar41._16_4_ = auVar19._16_4_ * 1.442695 + 0.5;
          auVar41._20_4_ = auVar19._20_4_ * 1.442695 + 0.5;
          auVar41._24_4_ = auVar19._24_4_ * 1.442695 + 0.5;
          auVar41._28_4_ = 0x42b1c0a5;
          auVar20 = vroundps_avx(auVar41,1);
          auVar17 = vcmpps_avx(auVar41,auVar20,1);
          auVar17 = vandps_avx(auVar50._0_32_,auVar17);
          auVar17 = vsubps_avx(auVar20,auVar17);
          fVar10 = auVar19._0_4_ + auVar17._0_4_ * -0.6931472;
          fVar28 = auVar19._4_4_ + auVar17._4_4_ * -0.6931472;
          fVar29 = auVar19._8_4_ + auVar17._8_4_ * -0.6931472;
          fVar30 = auVar19._12_4_ + auVar17._12_4_ * -0.6931472;
          fVar31 = auVar19._16_4_ + auVar17._16_4_ * -0.6931472;
          fVar33 = auVar19._20_4_ + auVar17._20_4_ * -0.6931472;
          fVar34 = auVar19._24_4_ + auVar17._24_4_ * -0.6931472;
          auVar43._0_4_ = (int)auVar17._0_4_;
          auVar43._4_4_ = (int)auVar17._4_4_;
          auVar43._8_4_ = (int)auVar17._8_4_;
          auVar43._12_4_ = (int)auVar17._12_4_;
          auVar42._16_4_ = (int)auVar17._16_4_;
          auVar42._0_16_ = auVar43;
          auVar42._20_4_ = (int)auVar17._20_4_;
          auVar42._24_4_ = (int)auVar17._24_4_;
          auVar42._28_4_ = (int)auVar17._28_4_;
          auVar43 = vpslld_avx(auVar43,0x17);
          auVar36 = vpslld_avx(auVar42._16_16_,0x17);
          auVar36 = vpaddd_avx(auVar36,auVar46);
          auVar43 = vpaddd_avx(auVar43,auVar46);
          auVar18._0_4_ =
               auVar50._0_4_ +
               (auVar50._0_4_ + fVar10 +
               fVar10 * fVar10 *
               (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
                 0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar43._0_4_;
          auVar18._4_4_ =
               auVar50._4_4_ +
               (auVar50._4_4_ + fVar28 +
               fVar28 * fVar28 *
               (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                 0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar43._4_4_;
          auVar18._8_4_ =
               auVar50._8_4_ +
               (auVar50._8_4_ + fVar29 +
               fVar29 * fVar29 *
               (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                 0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar43._8_4_;
          auVar18._12_4_ =
               auVar50._12_4_ +
               (auVar50._12_4_ + fVar30 +
               fVar30 * fVar30 *
               (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
                 0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar43._12_4_;
          auVar18._16_4_ =
               auVar50._16_4_ +
               (auVar50._16_4_ + fVar31 +
               fVar31 * fVar31 *
               (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5)) * auVar36._0_4_;
          auVar18._20_4_ =
               auVar50._20_4_ +
               (auVar50._20_4_ + fVar33 +
               fVar33 * fVar33 *
               (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                 0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar36._4_4_;
          auVar18._24_4_ =
               auVar50._24_4_ +
               (auVar50._24_4_ + fVar34 +
               fVar34 * fVar34 *
               (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
                 0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar36._8_4_;
          auVar18._28_4_ =
               auVar50._28_4_ + auVar50._28_4_ + auVar19._28_4_ + auVar20._28_4_ + auVar20._28_4_;
          auVar17 = vdivps_avx(auVar50._0_32_,auVar18);
          *pauVar8 = auVar17;
          pauVar8 = pauVar8 + 1;
          iVar2 = iVar2 + 8;
          uVar3 = uVar6 & 0xfffffff8;
        } while (iVar2 < (int)uVar6);
      }
      auVar47._8_4_ = 0x3f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar47._12_4_ = 0x3f800000;
      auVar48._8_4_ = 0x42b0c0a5;
      auVar48._0_8_ = 0x42b0c0a542b0c0a5;
      auVar48._12_4_ = 0x42b0c0a5;
      auVar32._8_4_ = 0xc2b0c0a5;
      auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar32._12_4_ = 0xc2b0c0a5;
      uVar5 = uVar3 | 3;
      while ((int)uVar5 < (int)uVar6) {
        auVar35 = *(undefined1 (*) [16])*pauVar8;
        auVar12._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
        auVar12._8_4_ = auVar35._8_4_ ^ 0x80000000;
        auVar12._12_4_ = auVar35._12_4_ ^ 0x80000000;
        auVar35 = vminps_avx(auVar12,auVar48);
        auVar46 = vmaxps_avx(auVar32,auVar35);
        auVar37._0_4_ = auVar46._0_4_ * 1.442695 + 0.5;
        auVar37._4_4_ = auVar46._4_4_ * 1.442695 + 0.5;
        auVar37._8_4_ = auVar46._8_4_ * 1.442695 + 0.5;
        auVar37._12_4_ = auVar46._12_4_ * 1.442695 + 0.5;
        auVar44._0_4_ = (int)auVar37._0_4_;
        auVar44._4_4_ = (int)auVar37._4_4_;
        auVar44._8_4_ = (int)auVar37._8_4_;
        auVar44._12_4_ = (int)auVar37._12_4_;
        auVar36 = vcvtdq2ps_avx(auVar44);
        auVar35 = vcmpps_avx(auVar37,auVar36,1);
        auVar35 = vandps_avx(auVar35,auVar47);
        auVar36 = vsubps_avx(auVar36,auVar35);
        fVar10 = auVar46._0_4_ + auVar36._0_4_ * -0.6931472;
        fVar28 = auVar46._4_4_ + auVar36._4_4_ * -0.6931472;
        fVar29 = auVar46._8_4_ + auVar36._8_4_ * -0.6931472;
        fVar30 = auVar46._12_4_ + auVar36._12_4_ * -0.6931472;
        auVar35._8_4_ = 0x3e2aaaaa;
        auVar35._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar35._12_4_ = 0x3e2aaaaa;
        auVar38._0_4_ = (int)auVar36._0_4_;
        auVar38._4_4_ = (int)auVar36._4_4_;
        auVar38._8_4_ = (int)auVar36._8_4_;
        auVar38._12_4_ = (int)auVar36._12_4_;
        auVar36 = vpslld_avx(auVar38,0x17);
        auVar36 = vpaddd_avx(auVar36,auVar47);
        auVar13._0_4_ =
             (fVar10 + 1.0 +
             fVar10 * fVar10 *
             (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
               0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar36._0_4_ + 1.0;
        auVar13._4_4_ =
             (fVar28 + 1.0 +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar36._4_4_ + 1.0;
        auVar13._8_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar36._8_4_ + 1.0;
        auVar13._12_4_ =
             (fVar30 + 1.0 +
             fVar30 * fVar30 *
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar36._12_4_ + 1.0;
        auVar36 = vdivps_avx(auVar47,auVar13);
        *(undefined1 (*) [16])*pauVar8 = auVar36;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        uVar5 = uVar3 + 7;
        uVar3 = uVar3 + 4;
      }
      auVar35 = vpcmpeqd_avx(auVar35,auVar35);
      if ((int)uVar3 < (int)uVar6) {
        uVar4 = CONCAT44(0,~uVar3 + uVar6);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar4;
        auVar43 = vpshufd_avx(auVar14,0x44);
        auVar36 = vorps_avx(auVar43,auVar11);
        auVar46 = vorps_avx(auVar43,auVar11);
        uVar9 = 0;
        auVar40 = _DAT_005f08a0;
        do {
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar9;
          auVar47 = vpshufd_avx(auVar15,0x44);
          auVar19._16_16_ = auVar47;
          auVar19._0_16_ = auVar47;
          auVar45 = vorps_avx(auVar19,_DAT_005f0880);
          auVar40 = vorps_avx(auVar19,auVar40);
          auVar32 = vpor_avx(auVar43,auVar11);
          auVar47 = vpcmpgtq_avx(auVar40._16_16_ ^ auVar11,auVar32);
          auVar48 = vpcmpgtq_avx(auVar40._0_16_ ^ auVar11,auVar36);
          auVar47 = vpackssdw_avx(auVar48,auVar47);
          auVar48 = vpcmpgtq_avx(auVar45._16_16_ ^ auVar11,auVar32);
          auVar39._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
          auVar39._8_4_ = auVar45._8_4_;
          auVar39._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar32 = vpcmpgtq_avx(auVar39,auVar46);
          auVar48 = vpackssdw_avx(auVar32,auVar48);
          auVar47 = vpackssdw_avx(auVar48 ^ auVar35,auVar47 ^ auVar35);
          auVar48 = vpmovsxwd_avx(auVar47);
          auVar47 = vpunpckhwd_avx(auVar47,auVar47);
          auVar20._16_16_ = auVar47;
          auVar20._0_16_ = auVar48;
          auVar40 = vmaskmovps_avx(auVar20,*(undefined1 (*) [32])(*pauVar8 + uVar9 * 4));
          auVar16._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
          auVar16._8_4_ = auVar40._8_4_ ^ 0x80000000;
          auVar16._12_4_ = auVar40._12_4_ ^ 0x80000000;
          auVar21._16_4_ = -auVar40._16_4_;
          auVar21._0_16_ = auVar16;
          auVar21._20_4_ = auVar40._20_4_ ^ 0x80000000;
          auVar21._24_4_ = auVar40._24_4_ ^ 0x80000000;
          auVar21._28_4_ = auVar40._28_4_ ^ 0x80000000;
          auVar32 = auVar21._16_16_;
          local_108._0_4_ = expf(auVar21._16_4_);
          local_108._4_4_ = extraout_XMM0_Db;
          local_108._8_4_ = extraout_XMM0_Dc;
          local_108._12_4_ = extraout_XMM0_Dd;
          auVar47 = vpermilps_avx(auVar32,0xf5);
          auVar50._0_4_ = expf(auVar47._0_4_);
          auVar50._4_60_ = extraout_var;
          auVar47 = vinsertps_avx(local_108,auVar50._0_16_,0x10);
          auVar48 = vpermilps_avx(auVar32,0x4e);
          auVar23._0_4_ = expf(auVar48._0_4_);
          auVar23._4_60_ = extraout_var_00;
          auVar47 = vinsertps_avx(auVar47,auVar23._0_16_,0x20);
          auVar48 = vpermilps_avx(auVar32,0xff);
          auVar24._0_4_ = expf(auVar48._0_4_);
          auVar24._4_60_ = extraout_var_01;
          auVar47 = vinsertps_avx(auVar47,auVar24._0_16_,0x30);
          local_b8 = (float)auVar16._0_8_;
          local_108._0_4_ = expf(local_b8);
          local_108._4_4_ = extraout_XMM0_Db_00;
          local_108._8_4_ = extraout_XMM0_Dc_00;
          local_108._12_4_ = extraout_XMM0_Dd_00;
          auVar48 = vpermilps_avx(auVar16,0xf5);
          auVar25._0_4_ = expf(auVar48._0_4_);
          auVar25._4_60_ = extraout_var_02;
          auVar48 = vinsertps_avx(local_108,auVar25._0_16_,0x10);
          auVar32 = vpermilps_avx(auVar16,0x4e);
          auVar26._0_4_ = expf(auVar32._0_4_);
          auVar26._4_60_ = extraout_var_03;
          auVar48 = vinsertps_avx(auVar48,auVar26._0_16_,0x20);
          auVar32 = vpermilps_avx(auVar16,0xff);
          auVar27._0_4_ = expf(auVar32._0_4_);
          auVar40 = _DAT_005f08a0;
          auVar27._4_60_ = extraout_var_04;
          auVar35 = vpcmpeqd_avx(auVar35,auVar35);
          auVar49._8_4_ = 0x3f800000;
          auVar49._0_8_ = 0x3f8000003f800000;
          auVar49._12_4_ = 0x3f800000;
          auVar49._16_4_ = 0x3f800000;
          auVar49._20_4_ = 0x3f800000;
          auVar49._24_4_ = 0x3f800000;
          auVar49._28_4_ = 0x3f800000;
          auVar50 = ZEXT3264(auVar49);
          auVar48 = vinsertps_avx(auVar48,auVar27._0_16_,0x30);
          auVar22._0_4_ = auVar48._0_4_ + 1.0;
          auVar22._4_4_ = auVar48._4_4_ + 1.0;
          auVar22._8_4_ = auVar48._8_4_ + 1.0;
          auVar22._12_4_ = auVar48._12_4_ + 1.0;
          auVar22._16_4_ = auVar47._0_4_ + 1.0;
          auVar22._20_4_ = auVar47._4_4_ + 1.0;
          auVar22._24_4_ = auVar47._8_4_ + 1.0;
          auVar22._28_4_ = auVar47._12_4_ + 1.0;
          auVar45 = vdivps_avx(auVar49,auVar22);
          auVar45 = vmaskmovps_avx(auVar20,auVar45);
          *(undefined1 (*) [32])(*pauVar8 + uVar9 * 4) = auVar45;
          uVar9 = uVar9 + 8;
        } while ((uVar4 + 8 & 0xfffffffffffffff8) != uVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}